

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O1

void __thiscall BamTools::OptionValue::~OptionValue(OptionValue *this)

{
  size_t *psVar1;
  ImplBase *pIVar2;
  pointer pcVar3;
  
  pIVar2 = (this->VariantValue).data;
  if (pIVar2 != (ImplBase *)0x0) {
    psVar1 = &pIVar2->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*pIVar2->_vptr_ImplBase[1])();
    }
  }
  pcVar3 = (this->ValueTypeDescription)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->ValueTypeDescription).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

struct UTILS_EXPORT OptionValue
{

    // data members
    bool* pFoundArgument;
    void* pValue;
    std::string ValueTypeDescription;
    bool UseVector;
    bool StoreValue;
    bool IsRequired;
    Variant VariantValue;

    // constructor
    OptionValue()
        : pFoundArgument(NULL)
        , pValue(NULL)
        , UseVector(false)
        , StoreValue(true)
        , IsRequired(false)
    {}
}